

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::XmlReporter::listListeners
          (XmlReporter *this,
          vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
          *descriptions)

{
  bool bVar1;
  char *__s;
  undefined8 in_RSI;
  long in_RDI;
  ScopedElement inner;
  ListenerDescription *listener;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *__range1;
  ScopedElement outerTag;
  XmlWriter *in_stack_fffffffffffffe78;
  XmlWriter *in_stack_fffffffffffffe80;
  XmlFormatting fmt;
  string *in_stack_fffffffffffffe88;
  XmlWriter *in_stack_fffffffffffffe90;
  XmlWriter *in_stack_fffffffffffffe98;
  XmlFormatting fmt_00;
  XmlWriter *in_stack_fffffffffffffea0;
  XmlWriter *in_stack_fffffffffffffea8;
  XmlWriter *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_109;
  string local_108 [4];
  XmlFormatting in_stack_fffffffffffffefc;
  XmlWriter *in_stack_ffffffffffffff00;
  StringRef in_stack_ffffffffffffff08;
  undefined1 local_d1 [40];
  undefined1 local_a9 [49];
  reference local_78;
  ListenerDescription *local_70;
  __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
  local_68;
  undefined8 local_60;
  allocator<char> local_41;
  string local_40 [48];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
             (allocator<char> *)in_stack_fffffffffffffeb0);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            (in_stack_fffffffffffffea8,(string *)in_stack_fffffffffffffea0,
             (XmlFormatting)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_60 = local_10;
  local_68._M_current =
       (ListenerDescription *)
       std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::begin
                 ((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *
                  )in_stack_fffffffffffffe78);
  local_70 = (ListenerDescription *)
             std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>::
             end((vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_> *)
                 in_stack_fffffffffffffe78);
  while( true ) {
    fmt_00 = (XmlFormatting)((ulong)in_stack_fffffffffffffe98 >> 0x20);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
                        *)in_stack_fffffffffffffe80,
                       (__normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
                        *)in_stack_fffffffffffffe78);
    if (!bVar1) break;
    local_78 = __gnu_cxx::
               __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
               ::operator*(&local_68);
    fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffe80 >> 0x20);
    __s = (char *)(in_RDI + 0x98);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,__s,(allocator<char> *)in_stack_fffffffffffffeb0);
    operator|(Newline,Indent);
    XmlWriter::scopedElement(in_stack_fffffffffffffea8,(string *)in_stack_fffffffffffffea0,fmt_00);
    std::__cxx11::string::~string((string *)(local_a9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_a9);
    in_stack_fffffffffffffea8 = (XmlWriter *)(in_RDI + 0x98);
    in_stack_fffffffffffffeb0 = (XmlWriter *)local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,__s,(allocator<char> *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffea0 =
         XmlWriter::startElement(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,fmt);
    in_stack_fffffffffffffe98 =
         XmlWriter::writeText
                   (in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,in_stack_fffffffffffffefc);
    XmlWriter::endElement
              (in_stack_fffffffffffffeb0,(XmlFormatting)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    std::__cxx11::string::~string((string *)(local_d1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_d1);
    in_stack_fffffffffffffe88 = (string *)(in_RDI + 0x98);
    in_stack_fffffffffffffe90 = (XmlWriter *)&local_109;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,__s,(allocator<char> *)in_stack_fffffffffffffeb0);
    in_stack_fffffffffffffe80 =
         XmlWriter::startElement(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,fmt);
    StringRef::StringRef((StringRef *)in_stack_fffffffffffffe80,(string *)in_stack_fffffffffffffe78)
    ;
    in_stack_fffffffffffffe78 =
         XmlWriter::writeText
                   (in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,in_stack_fffffffffffffefc);
    XmlWriter::endElement
              (in_stack_fffffffffffffeb0,(XmlFormatting)((ulong)in_stack_fffffffffffffea8 >> 0x20));
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator(&local_109);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe80);
    __gnu_cxx::
    __normal_iterator<const_Catch::ListenerDescription_*,_std::vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>_>
    ::operator++(&local_68);
  }
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffe80);
  return;
}

Assistant:

void XmlReporter::listListeners(std::vector<ListenerDescription> const& descriptions) {
        auto outerTag = m_xml.scopedElement( "RegisteredListeners" );
        for ( auto const& listener : descriptions ) {
            auto inner = m_xml.scopedElement( "Listener" );
            m_xml.startElement( "Name", XmlFormatting::Indent )
                .writeText( listener.name, XmlFormatting::None )
                .endElement( XmlFormatting::Newline );
            m_xml.startElement( "Description", XmlFormatting::Indent )
                .writeText( listener.description, XmlFormatting::None )
                .endElement( XmlFormatting::Newline );
        }
    }